

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O1

void Update_Chan_Algo7_Int(ym2612_ *YM2612,channel_ *CH,DEV_SMPL **buf,UINT32 length)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  if (((CH->SLOT[0].Ecnt == 0x20000000) && (CH->SLOT[2].Ecnt == 0x20000000)) &&
     (CH->SLOT[1].Ecnt == 0x20000000)) {
    if (CH->SLOT[3].Ecnt == 0x20000000 || length == 0) {
      return;
    }
  }
  else if (length == 0) {
    return;
  }
  uVar6 = 0;
  do {
    iVar4 = CH->SLOT[0].Fcnt;
    YM2612->in0 = iVar4;
    iVar5 = CH->SLOT[2].Fcnt;
    YM2612->in1 = iVar5;
    iVar1 = CH->SLOT[1].Fcnt;
    YM2612->in2 = iVar1;
    iVar2 = CH->SLOT[3].Fcnt;
    YM2612->in3 = iVar2;
    CH->SLOT[0].Fcnt = iVar4 + CH->SLOT[0].Finc;
    CH->SLOT[2].Fcnt = iVar5 + CH->SLOT[2].Finc;
    CH->SLOT[1].Fcnt = iVar1 + CH->SLOT[1].Finc;
    CH->SLOT[3].Fcnt = iVar2 + CH->SLOT[3].Finc;
    if ((CH->SLOT[0].SEG & 4) == 0) {
      uVar3 = ENV_TAB[*(short *)((long)&CH->SLOT[0].Ecnt + 2)] + CH->SLOT[0].TLL;
LAB_0013f064:
      YM2612->en0 = uVar3;
    }
    else {
      uVar3 = ENV_TAB[*(short *)((long)&CH->SLOT[0].Ecnt + 2)] + CH->SLOT[0].TLL;
      YM2612->en0 = uVar3;
      if ((int)uVar3 < 0x1000) {
        uVar3 = uVar3 ^ 0xfff;
        goto LAB_0013f064;
      }
      YM2612->en0 = 0;
    }
    if ((CH->SLOT[2].SEG & 4) == 0) {
      YM2612->en1 = CH->SLOT[2].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[2].Ecnt + 2)];
    }
    else {
      uVar3 = CH->SLOT[2].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[2].Ecnt + 2)];
      YM2612->en1 = uVar3;
      if ((int)uVar3 < 0x1000) {
        YM2612->en1 = uVar3 ^ 0xfff;
      }
      else {
        YM2612->en1 = 0;
      }
    }
    if ((CH->SLOT[1].SEG & 4) == 0) {
      YM2612->en2 = CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
    }
    else {
      uVar3 = CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
      YM2612->en2 = uVar3;
      if ((int)uVar3 < 0x1000) {
        YM2612->en2 = uVar3 ^ 0xfff;
      }
      else {
        YM2612->en2 = 0;
      }
    }
    if ((CH->SLOT[3].SEG & 4) == 0) {
      YM2612->en3 = CH->SLOT[3].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)];
    }
    else {
      uVar3 = CH->SLOT[3].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)];
      YM2612->en3 = uVar3;
      if ((int)uVar3 < 0x1000) {
        YM2612->en3 = uVar3 ^ 0xfff;
      }
      else {
        YM2612->en3 = 0;
      }
    }
    iVar4 = CH->SLOT[0].Ecnt + CH->SLOT[0].Einc;
    CH->SLOT[0].Ecnt = iVar4;
    if (CH->SLOT[0].Ecmp <= iVar4) {
      (*ENV_NEXT_EVENT[CH->SLOT[0].Ecurp])(YM2612,CH->SLOT);
    }
    iVar4 = CH->SLOT[2].Ecnt + CH->SLOT[2].Einc;
    CH->SLOT[2].Ecnt = iVar4;
    if (CH->SLOT[2].Ecmp <= iVar4) {
      (*ENV_NEXT_EVENT[CH->SLOT[2].Ecurp])(YM2612,CH->SLOT + 2);
    }
    iVar4 = CH->SLOT[1].Ecnt + CH->SLOT[1].Einc;
    CH->SLOT[1].Ecnt = iVar4;
    if (CH->SLOT[1].Ecmp <= iVar4) {
      (*ENV_NEXT_EVENT[CH->SLOT[1].Ecurp])(YM2612,CH->SLOT + 1);
    }
    iVar4 = CH->SLOT[3].Ecnt + CH->SLOT[3].Einc;
    CH->SLOT[3].Ecnt = iVar4;
    if (CH->SLOT[3].Ecmp <= iVar4) {
      (*ENV_NEXT_EVENT[CH->SLOT[3].Ecurp])(YM2612,CH->SLOT + 3);
    }
    YM2612->in0 = YM2612->in0 + (CH->S0_OUT[1] + CH->S0_OUT[0] >> ((byte)CH->FB & 0x1f));
    iVar4 = CH->S0_OUT[0];
    CH->S0_OUT[1] = iVar4;
    CH->S0_OUT[0] =
         *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in0 >> 0xb & 0x7ff8)) +
                 (long)YM2612->en0 * 4);
    iVar4 = iVar4 + *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in3 >> 0xb & 0x7ff8)) +
                            (long)YM2612->en3 * 4) +
            *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in1 >> 0xb & 0x7ff8)) +
                    (long)YM2612->en1 * 4) +
            *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in2 >> 0xb & 0x7ff8)) +
                    (long)YM2612->en2 * 4) >> 0xf;
    CH->OUTd = iVar4;
    iVar5 = 0x2fff;
    if ((0x2fff < iVar4) || (iVar5 = -0x2fff, iVar4 < -0x2fff)) {
      CH->OUTd = iVar5;
    }
    uVar3 = YM2612->Inter_Cnt + YM2612->Inter_Step;
    YM2612->Inter_Cnt = uVar3;
    if ((uVar3 >> 0xe & 1) != 0) {
      uVar3 = uVar3 & 0x3fff;
      YM2612->Inter_Cnt = uVar3;
      uVar3 = uVar3 * CH->Old_OUTd + (uVar3 ^ 0x3fff) * CH->OUTd >> 0xe;
      CH->Old_OUTd = uVar3;
      (*buf)[uVar6] = (*buf)[uVar6] + (uVar3 & CH->LEFT);
      buf[1][uVar6] = buf[1][uVar6] + (CH->RIGHT & CH->Old_OUTd);
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    CH->Old_OUTd = CH->OUTd;
    if (length <= (uint)uVar6) {
      return;
    }
  } while( true );
}

Assistant:

static void Update_Chan_Algo7_Int(ym2612_ *YM2612, channel_ *CH, DEV_SMPL **buf, UINT32 length)
{
  UINT32 i;

  if ((CH->SLOT[S0].Ecnt == ENV_END) && (CH->SLOT[S1].Ecnt == ENV_END) && (CH->SLOT[S2].Ecnt == ENV_END) && (CH->SLOT[S3].Ecnt == ENV_END))
    return;

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nAlgo 7 len = %d\n\n", length);
#endif

  for (i = 0; i < length; i++)
  {
    GET_CURRENT_PHASE
    UPDATE_PHASE
    GET_CURRENT_ENV
    UPDATE_ENV
    DO_ALGO_7
    DO_OUTPUT_INT
  }
}